

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_0::LinesTestGroup::init
          (LinesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  LineCase *pLVar1;
  TestNode *pTVar2;
  ColoredLineData *linesEnd;
  ColorlessLineData longTestLines [4];
  ColorlessLineData viewportTestLines [11];
  ColoredLineData colorTestLines [4];
  ColorlessLineData depthTestLines [5];
  
  viewportTestLines[0].p0.m_data[0] = 0.0;
  viewportTestLines[0].p0.m_data[1] = 0.0;
  viewportTestLines[0].p0.m_data[2] = 0.0;
  viewportTestLines[0].p0.m_data[3] = 1.0;
  viewportTestLines[0].p1.m_data[0] = 0.0;
  viewportTestLines[0].p1.m_data[1] = 1.5;
  viewportTestLines[0].p1.m_data[2] = 0.0;
  viewportTestLines[0].p1.m_data[3] = 1.0;
  viewportTestLines[1].p0.m_data[0] = 0.0;
  viewportTestLines[1].p0.m_data[1] = 0.0;
  viewportTestLines[1].p0.m_data[2] = 0.0;
  viewportTestLines[1].p0.m_data[3] = 1.0;
  viewportTestLines[1].p1.m_data[0] = -1.5;
  viewportTestLines[1].p1.m_data[1] = 1.0;
  viewportTestLines[1].p1.m_data[2] = 0.0;
  viewportTestLines[1].p1.m_data[3] = 1.0;
  viewportTestLines[2].p0.m_data[0] = 0.0;
  viewportTestLines[2].p0.m_data[1] = 0.0;
  viewportTestLines[2].p0.m_data[2] = 0.0;
  viewportTestLines[2].p0.m_data[3] = 1.0;
  viewportTestLines[2].p1.m_data[0] = -1.5;
  viewportTestLines[2].p1.m_data[1] = 0.0;
  viewportTestLines[2].p1.m_data[2] = 0.0;
  viewportTestLines[2].p1.m_data[3] = 1.0;
  viewportTestLines[3].p0.m_data[0] = 0.0;
  viewportTestLines[3].p0.m_data[1] = 0.0;
  viewportTestLines[3].p0.m_data[2] = 0.0;
  viewportTestLines[3].p0.m_data[3] = 1.0;
  viewportTestLines[3].p1.m_data[0] = 0.2;
  viewportTestLines[3].p1.m_data[1] = 0.4;
  viewportTestLines[3].p1.m_data[2] = 1.5;
  viewportTestLines[3].p1.m_data[3] = 1.0;
  viewportTestLines[4].p0.m_data[0] = 0.0;
  viewportTestLines[4].p0.m_data[1] = 0.0;
  viewportTestLines[4].p0.m_data[2] = 0.0;
  viewportTestLines[4].p0.m_data[3] = 1.0;
  viewportTestLines[4].p1.m_data[0] = -2.0;
  viewportTestLines[4].p1.m_data[1] = -1.0;
  viewportTestLines[4].p1.m_data[2] = 0.0;
  viewportTestLines[4].p1.m_data[3] = 1.0;
  viewportTestLines[5].p0.m_data[0] = 0.0;
  viewportTestLines[5].p0.m_data[1] = 0.0;
  viewportTestLines[5].p0.m_data[2] = 0.0;
  viewportTestLines[5].p0.m_data[3] = 1.0;
  viewportTestLines[5].p1.m_data[0] = 1.0;
  viewportTestLines[5].p1.m_data[1] = 0.1;
  viewportTestLines[5].p1.m_data[2] = 0.0;
  viewportTestLines[5].p1.m_data[3] = 0.6;
  viewportTestLines[6].p0.m_data[0] = 1.5;
  viewportTestLines[6].p0.m_data[1] = 0.0;
  viewportTestLines[6].p0.m_data[2] = 0.0;
  viewportTestLines[6].p0.m_data[3] = 1.0;
  viewportTestLines[6].p1.m_data[0] = 0.8;
  viewportTestLines[6].p1.m_data[1] = -0.2;
  viewportTestLines[6].p1.m_data[2] = 0.0;
  viewportTestLines[6].p1.m_data[3] = 1.0;
  viewportTestLines[7].p0.m_data[0] = 0.0;
  viewportTestLines[7].p0.m_data[1] = -1.5;
  viewportTestLines[7].p0.m_data[2] = 0.0;
  viewportTestLines[7].p0.m_data[3] = 1.0;
  viewportTestLines[7].p1.m_data[0] = 0.9;
  viewportTestLines[7].p1.m_data[1] = -0.7;
  viewportTestLines[7].p1.m_data[2] = 0.0;
  viewportTestLines[7].p1.m_data[3] = 1.0;
  viewportTestLines[8].p0.m_data[0] = 0.0;
  viewportTestLines[8].p0.m_data[1] = -1.3;
  viewportTestLines[8].p0.m_data[2] = 0.0;
  viewportTestLines[8].p0.m_data[3] = 1.0;
  viewportTestLines[8].p1.m_data[0] = 1.3;
  viewportTestLines[8].p1.m_data[1] = 0.0;
  viewportTestLines[8].p1.m_data[2] = 0.0;
  viewportTestLines[8].p1.m_data[3] = 1.0;
  viewportTestLines[9].p0.m_data[0] = -0.8;
  viewportTestLines[9].p0.m_data[1] = -1.01;
  viewportTestLines[9].p0.m_data[2] = 0.0;
  viewportTestLines[9].p0.m_data[3] = 1.0;
  viewportTestLines[9].p1.m_data[0] = 0.0;
  viewportTestLines[9].p1.m_data[1] = -1.01;
  viewportTestLines[9].p1.m_data[2] = 0.0;
  viewportTestLines[9].p1.m_data[3] = 1.0;
  viewportTestLines[10].p0.m_data[0] = -2.01;
  viewportTestLines[10].p0.m_data[1] = 0.0;
  viewportTestLines[10].p0.m_data[2] = 0.0;
  viewportTestLines[10].p0.m_data[3] = 1.0;
  viewportTestLines[10].p1.m_data[0] = 0.0;
  viewportTestLines[10].p1.m_data[1] = -2.01;
  viewportTestLines[10].p1.m_data[2] = 0.0;
  viewportTestLines[10].p1.m_data[3] = 1.0;
  depthTestLines[0].p0.m_data[0] = 0.0;
  depthTestLines[0].p0.m_data[1] = 0.0;
  depthTestLines[0].p0.m_data[2] = 0.0;
  depthTestLines[0].p0.m_data[3] = 1.0;
  depthTestLines[0].p1.m_data[0] = 1.3;
  depthTestLines[0].p1.m_data[1] = 1.0;
  depthTestLines[0].p1.m_data[2] = 2.0;
  depthTestLines[0].p1.m_data[3] = 1.0;
  depthTestLines[1].p0.m_data[0] = 0.0;
  depthTestLines[1].p0.m_data[1] = 0.0;
  depthTestLines[1].p0.m_data[2] = 0.0;
  depthTestLines[1].p0.m_data[3] = 1.0;
  depthTestLines[1].p1.m_data[0] = 1.3;
  depthTestLines[1].p1.m_data[1] = -1.0;
  depthTestLines[1].p1.m_data[2] = 2.0;
  depthTestLines[1].p1.m_data[3] = 1.0;
  depthTestLines[2].p0.m_data[0] = 0.0;
  depthTestLines[2].p0.m_data[1] = 0.0;
  depthTestLines[2].p0.m_data[2] = 0.0;
  depthTestLines[2].p0.m_data[3] = 1.0;
  depthTestLines[2].p1.m_data[0] = -1.0;
  depthTestLines[2].p1.m_data[1] = -1.1;
  depthTestLines[2].p1.m_data[2] = -2.0;
  depthTestLines[2].p1.m_data[3] = 1.0;
  depthTestLines[3].p0.m_data[0] = 0.0;
  depthTestLines[3].p0.m_data[1] = 0.0;
  depthTestLines[3].p0.m_data[2] = 0.0;
  depthTestLines[3].p0.m_data[3] = 1.0;
  depthTestLines[3].p1.m_data[0] = -1.0;
  depthTestLines[3].p1.m_data[1] = 1.1;
  depthTestLines[3].p1.m_data[2] = -2.0;
  depthTestLines[3].p1.m_data[3] = 1.0;
  depthTestLines[4].p0.m_data[0] = 0.0;
  depthTestLines[4].p0.m_data[1] = 0.0;
  depthTestLines[4].p0.m_data[2] = 0.0;
  depthTestLines[4].p0.m_data[3] = 1.0;
  depthTestLines[4].p1.m_data[0] = 1.0;
  depthTestLines[4].p1.m_data[1] = 0.1;
  depthTestLines[4].p1.m_data[2] = 2.0;
  depthTestLines[4].p1.m_data[3] = 0.6;
  longTestLines[0].p0.m_data[0] = -41000.0;
  longTestLines[0].p0.m_data[1] = -40000.0;
  longTestLines[0].p0.m_data[2] = -1e+06;
  longTestLines[0].p0.m_data[3] = 1.0;
  longTestLines[0].p1.m_data[0] = 41000.0;
  longTestLines[0].p1.m_data[1] = 40000.0;
  longTestLines[0].p1.m_data[2] = 1e+06;
  longTestLines[0].p1.m_data[3] = 1.0;
  longTestLines[1].p0.m_data[0] = 41000.0;
  longTestLines[1].p0.m_data[1] = -40000.0;
  longTestLines[1].p0.m_data[2] = 1e+06;
  longTestLines[1].p0.m_data[3] = 1.0;
  longTestLines[1].p1.m_data[0] = -41000.0;
  longTestLines[1].p1.m_data[1] = 40000.0;
  longTestLines[1].p1.m_data[2] = -1e+06;
  longTestLines[1].p1.m_data[3] = 1.0;
  longTestLines[2].p0.m_data[0] = 0.5;
  longTestLines[2].p0.m_data[1] = -40000.0;
  longTestLines[2].p0.m_data[2] = 100000.0;
  longTestLines[2].p0.m_data[3] = 1.0;
  longTestLines[2].p1.m_data[0] = 0.5;
  longTestLines[2].p1.m_data[1] = 40000.0;
  longTestLines[2].p1.m_data[2] = -100000.0;
  longTestLines[2].p1.m_data[3] = 1.0;
  longTestLines[3].p0.m_data[0] = -0.5;
  longTestLines[3].p0.m_data[1] = 40000.0;
  longTestLines[3].p0.m_data[2] = 100000.0;
  longTestLines[3].p0.m_data[3] = 1.0;
  longTestLines[3].p1.m_data[0] = -0.5;
  longTestLines[3].p1.m_data[1] = -40000.0;
  longTestLines[3].p1.m_data[2] = -100000.0;
  longTestLines[3].p1.m_data[3] = 1.0;
  colorTestLines[0].p0.m_data[0] = 0.0;
  colorTestLines[0].p0.m_data[1] = 0.0;
  colorTestLines[0].p0.m_data[2] = 0.0;
  colorTestLines[0].p0.m_data[3] = 1.0;
  colorTestLines[0].c0.m_data[0] = 1.0;
  colorTestLines[0].c0.m_data[1] = 0.0;
  colorTestLines[0].c0.m_data[2] = 0.0;
  colorTestLines[0].c0.m_data[3] = 1.0;
  colorTestLines[0].p1.m_data[0] = 1.3;
  colorTestLines[0].p1.m_data[1] = 1.0;
  colorTestLines[0].p1.m_data[2] = 2.0;
  colorTestLines[0].p1.m_data[3] = 1.0;
  colorTestLines[0].c1.m_data._0_8_ = &DAT_3f8000003f800000;
  colorTestLines[0].c1.m_data[2] = 0.0;
  colorTestLines[0].c1.m_data[3] = 1.0;
  colorTestLines[1].p0.m_data[0] = 0.0;
  colorTestLines[1].p0.m_data[1] = 0.0;
  colorTestLines[1].p0.m_data[2] = 0.0;
  colorTestLines[1].p0.m_data[3] = 1.0;
  colorTestLines[1].c0.m_data[0] = 1.0;
  colorTestLines[1].c0.m_data[1] = 0.0;
  colorTestLines[1].c0.m_data[2] = 0.0;
  colorTestLines[1].c0.m_data[3] = 1.0;
  colorTestLines[1].p1.m_data[0] = 1.3;
  colorTestLines[1].p1.m_data[1] = -1.0;
  colorTestLines[1].p1.m_data[2] = 2.0;
  colorTestLines[1].p1.m_data[3] = 1.0;
  colorTestLines[1].c1.m_data[0] = 0.3;
  colorTestLines[1].c1.m_data[1] = 0.3;
  colorTestLines[1].c1.m_data._8_8_ = &DAT_3f8000003f800000;
  colorTestLines[2].p0.m_data[0] = 0.0;
  colorTestLines[2].p0.m_data[1] = 0.0;
  colorTestLines[2].p0.m_data[2] = 0.0;
  colorTestLines[2].p0.m_data[3] = 1.0;
  colorTestLines[2].c0.m_data[0] = 1.0;
  colorTestLines[2].c0.m_data[1] = 0.0;
  colorTestLines[2].c0.m_data[2] = 0.0;
  colorTestLines[2].c0.m_data[3] = 1.0;
  colorTestLines[2].p1.m_data[0] = -1.0;
  colorTestLines[2].p1.m_data[1] = -1.0;
  colorTestLines[2].p1.m_data[2] = -2.0;
  colorTestLines[2].p1.m_data[3] = 1.0;
  colorTestLines[2].c1.m_data._0_8_ = &DAT_3f8000003f800000;
  colorTestLines[2].c1.m_data[2] = 0.0;
  colorTestLines[2].c1.m_data[3] = 1.0;
  colorTestLines[3].p0.m_data[0] = 0.0;
  colorTestLines[3].p0.m_data[1] = 0.0;
  colorTestLines[3].p0.m_data[2] = 0.0;
  colorTestLines[3].p0.m_data[3] = 1.0;
  colorTestLines[3].c0.m_data[0] = 1.0;
  colorTestLines[3].c0.m_data[1] = 0.0;
  colorTestLines[3].c0.m_data[2] = 0.0;
  colorTestLines[3].c0.m_data[3] = 1.0;
  colorTestLines[3].p1.m_data[0] = -1.0;
  colorTestLines[3].p1.m_data[1] = 1.0;
  colorTestLines[3].p1.m_data[2] = -2.0;
  colorTestLines[3].p1.m_data[3] = 1.0;
  colorTestLines[3].c1.m_data[0] = 0.3;
  colorTestLines[3].c1.m_data[1] = 0.3;
  colorTestLines[3].c1.m_data._8_8_ = &DAT_3f8000003f800000;
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip","line z clipping",
                     depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip_viewport_center",
                     "line z clipping",depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8,
                     1.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip_viewport_corner",
                     "line z clipping",depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8,
                     1.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_clip_viewport_center",
                     "line viewport clipping",viewportTestLines,(ColorlessLineData *)colorTestLines,
                     1.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_clip_viewport_corner",
                     "line viewport clipping",viewportTestLines,(ColorlessLineData *)colorTestLines,
                     1.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip",
                     "line z clipping",depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8,
                     5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip_viewport_center"
                     ,"line z clipping",depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8
                     ,5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip_viewport_corner"
                     ,"line z clipping",depthTestLines,(ColorlessLineData *)&stack0xffffffffffffffc8
                     ,5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip",
                     "line viewport clipping",viewportTestLines,(ColorlessLineData *)colorTestLines,
                     5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip_viewport_center",
                     "line viewport clipping",viewportTestLines,(ColorlessLineData *)colorTestLines,
                     5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip_viewport_corner",
                     "line viewport clipping",viewportTestLines,(ColorlessLineData *)colorTestLines,
                     5.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  linesEnd = (ColoredLineData *)viewportTestLines;
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"long_line_clip",
                     "line viewport clipping",longTestLines,(ColorlessLineData *)linesEnd,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"long_wide_line_clip",
                     "line viewport clipping",longTestLines,(ColorlessLineData *)linesEnd,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pTVar2 = (TestNode *)operator_new(0xa8);
  ColoredLineCase::ColoredLineCase
            ((ColoredLineCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_attrib_clip",
             (char *)colorTestLines,(ColoredLineData *)depthTestLines,linesEnd,1.0,
             (WindowRectangle *)longTestLines[0].p0.m_data._0_8_);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  ColoredLineCase::ColoredLineCase
            ((ColoredLineCase *)pTVar2,(this->super_TestCaseGroup).m_context,"wide_line_attrib_clip"
             ,(char *)colorTestLines,(ColoredLineData *)depthTestLines,linesEnd,5.0,
             (WindowRectangle *)longTestLines[0].p0.m_data._0_8_);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void LinesTestGroup::init (void)
{
	const float littleOverViewport = 1.0f + (2.0f / (TEST_CANVAS_SIZE)); // one pixel over the viewport edge in VIEWPORT_WHOLE, half pixels over in the reduced viewport.

	// lines
	const LineRenderTestCase::ColorlessLineData viewportTestLines[] =
	{
		// from center to outside of viewport
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.0f,  1.5f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.5f,  1.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.5f,  0.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.2f,  0.4f,  1.5f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-2.0f, -1.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.0f,  0.1f,  0.0f,  0.6f)},

		// from outside to inside of viewport
		{tcu::Vec4( 1.5f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.8f, -0.2f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f, -1.5f,  0.0f,  1.0f),		tcu::Vec4( 0.9f, -0.7f,  0.0f,  1.0f)},

		// from outside to outside
		{tcu::Vec4( 0.0f, -1.3f,  0.0f,  1.0f),		tcu::Vec4( 1.3f,  0.0f,  0.0f,  1.0f)},

		// outside the viewport, wide lines have fragments in the viewport
		{tcu::Vec4(-0.8f,                      -littleOverViewport,  0.0f,  1.0f),	tcu::Vec4( 0.0f, -littleOverViewport,         0.0f,  1.0f)},
		{tcu::Vec4(-littleOverViewport - 1.0f,  0.0f,                0.0f,  1.0f),	tcu::Vec4( 0.0f, -littleOverViewport - 1.0f,  0.0f,  1.0f)},
	};
	const LineRenderTestCase::ColorlessLineData depthTestLines[] =
	{
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.3f,  1.0f,  2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.3f, -1.0f,  2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.0f, -1.1f, -2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.0f,  1.1f, -2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.0f,  0.1f,  2.0f,  0.6f)},
	};
	const LineRenderTestCase::ColorlessLineData longTestLines[] =
	{
		{tcu::Vec4( -41000.0f,		-40000.0f,		-1000000.0f,	1.0f),	tcu::Vec4( 41000.0f,		40000.0f,		1000000.0f,	1.0f)},
		{tcu::Vec4(  41000.0f,		-40000.0f,		 1000000.0f,	1.0f),	tcu::Vec4(-41000.0f,		40000.0f,	   -1000000.0f,	1.0f)},
		{tcu::Vec4(  0.5f,			-40000.0f,		 100000.0f,		1.0f),	tcu::Vec4( 0.5f,			40000.0f,	   -100000.0f,	1.0f)},
		{tcu::Vec4( -0.5f,			 40000.0f,		 100000.0f,		1.0f),	tcu::Vec4(-0.5f,		   -40000.0f,	   -100000.0f,	1.0f)},
	};

	// line attribute clipping
	const tcu::Vec4 red			(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 lightBlue	(0.3f, 0.3f, 1.0f, 1.0f);
	const LineRenderTestCase::ColoredLineData colorTestLines[] =
	{
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4( 1.3f,  1.0f,  2.0f,  1.0f),	yellow		},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4( 1.3f, -1.0f,  2.0f,  1.0f),	lightBlue	},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4(-1.0f, -1.0f, -2.0f,  1.0f),	yellow		},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4(-1.0f,  1.0f, -2.0f,  1.0f),	lightBlue	},
	};

	// line clipping
	addChild(new LineCase(m_context, "line_z_clip",							"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "line_z_clip_viewport_center",			"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "line_z_clip_viewport_corner",			"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "line_clip_viewport_center",			"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	1.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "line_clip_viewport_corner",			"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	1.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "wide_line_z_clip",					"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "wide_line_z_clip_viewport_center",	"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "wide_line_z_clip_viewport_corner",	"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "wide_line_clip",						"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "wide_line_clip_viewport_center",		"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "wide_line_clip_viewport_corner",		"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "long_line_clip",						"line viewport clipping",		DE_ARRAY_BEGIN(longTestLines),		DE_ARRAY_END(longTestLines),		1.0f,	VIEWPORT_WHOLE, 2));
	addChild(new LineCase(m_context, "long_wide_line_clip",					"line viewport clipping",		DE_ARRAY_BEGIN(longTestLines),		DE_ARRAY_END(longTestLines),		5.0f,	VIEWPORT_WHOLE, 2));

	// line attribute clipping
	addChild(new ColoredLineCase(m_context, "line_attrib_clip",				"line attribute clipping",		DE_ARRAY_BEGIN(colorTestLines),		DE_ARRAY_END(colorTestLines),		1.0f,	VIEWPORT_WHOLE));
	addChild(new ColoredLineCase(m_context, "wide_line_attrib_clip",		"line attribute clipping",		DE_ARRAY_BEGIN(colorTestLines),		DE_ARRAY_END(colorTestLines),		5.0f,	VIEWPORT_WHOLE));
}